

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O0

Am_Wrapper * name_from_value_proc(Am_Object *self)

{
  Am_Value *pAVar1;
  char *__src;
  ostream *poVar2;
  Am_Wrapper *pAVar3;
  Am_String local_40;
  Am_String local_38 [3];
  undefined1 local_20 [8];
  Am_Value value;
  Am_Object *self_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)self;
  Am_Value::Am_Value((Am_Value *)local_20);
  pAVar1 = Am_Object::Peek((Am_Object *)value.value.wrapper_value,0x169,0);
  Am_Value::operator=((Am_Value *)local_20,(Am_Value *)pAVar1);
  strcpy(name_from_value_proc::outs,"Color to ");
  if (local_20._0_2_ == 0x8008) {
    Am_String::Am_String(local_38,(Am_Value *)local_20);
    __src = Am_String::operator_cast_to_char_(local_38);
    strcat(name_from_value_proc::outs,__src);
    Am_String::~Am_String(local_38);
  }
  else {
    strcat(name_from_value_proc::outs,"White");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"new name for ");
  poVar2 = (ostream *)operator<<(poVar2,(Am_Object *)value.value.wrapper_value);
  poVar2 = std::operator<<(poVar2," is `");
  poVar2 = std::operator<<(poVar2,name_from_value_proc::outs);
  poVar2 = std::operator<<(poVar2,"\'\n");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  Am_String::Am_String(&local_40,name_from_value_proc::outs,true);
  pAVar3 = Am_String::operator_cast_to_Am_Wrapper_(&local_40);
  Am_String::~Am_String(&local_40);
  Am_Value::~Am_Value((Am_Value *)local_20);
  return pAVar3;
}

Assistant:

Am_Define_String_Formula(name_from_value)
{
  Am_Value value;
  value = self.Peek(Am_VALUE);
  static char outs[MAXNAMESIZE];
  strcpy(outs, COLORSTR);
  //concatenate current color on end
  if (value.type == Am_STRING) {
    strcat(outs, Am_String(value));
  } else
    strcat(outs, DEFAULTSTR);
  std::cout << "new name for " << self << " is `" << outs << "'\n"
            << std::flush;
  return Am_String(outs);
}